

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O3

void __thiscall
ipx::IPM::SolveNewtonSystem
          (IPM *this,double *rb,double *rc,double *rl,double *ru,double *sl,double *su,Step *step)

{
  double dVar1;
  double dVar2;
  StateDetail SVar3;
  int iVar4;
  Iterate *pIVar5;
  Model *pMVar6;
  pointer pSVar7;
  double *pdVar8;
  pointer piVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  int iVar15;
  size_t sVar16;
  long lVar17;
  double *pdVar18;
  double dVar19;
  double dVar20;
  Vector rhs2;
  Vector rhs1;
  Vector local_68;
  Vector local_58;
  size_t local_48;
  size_t local_40;
  double *local_38;
  
  pIVar5 = this->iterate_;
  pMVar6 = pIVar5->model_;
  sVar16 = (size_t)pMVar6->num_rows_;
  uVar11 = (long)pMVar6->num_cols_ + sVar16;
  local_58._M_size = uVar11;
  local_38 = rc;
  pdVar12 = (double *)operator_new(uVar11 * 8);
  local_58._M_data = pdVar12;
  memset(pdVar12,0,uVar11 * 8);
  uVar14 = sVar16 * 8;
  local_68._M_size = sVar16;
  local_40 = sVar16;
  pdVar13 = (double *)operator_new(uVar14);
  local_68._M_data = pdVar13;
  local_48 = uVar14;
  memset(pdVar13,0,uVar14);
  pdVar10 = local_38;
  iVar15 = (int)uVar11;
  if ((local_38 != (double *)0x0) && (0 < iVar15)) {
    uVar14 = 0;
    do {
      pdVar12[uVar14] = -local_38[uVar14];
      uVar14 = uVar14 + 1;
    } while ((uVar11 & 0xffffffff) != uVar14);
  }
  if (0 < iVar15) {
    pSVar7 = (this->iterate_->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar14 = 0;
    do {
      dVar19 = 0.0;
      dVar20 = 0.0;
      if (rl != (double *)0x0) {
        dVar20 = rl[uVar14];
      }
      if (ru != (double *)0x0) {
        dVar19 = ru[uVar14];
      }
      SVar3 = pSVar7[uVar14];
      if ((SVar3 & ~BARRIER_BOXED) == BARRIER_LB) {
        pdVar12[uVar14] =
             (dVar20 * (pIVar5->zl_)._M_data[uVar14] + sl[uVar14]) / (pIVar5->xl_)._M_data[uVar14] +
             pdVar12[uVar14];
      }
      if (SVar3 - BARRIER_UB < 2) {
        pdVar12[uVar14] =
             pdVar12[uVar14] -
             (su[uVar14] - dVar19 * (pIVar5->zu_)._M_data[uVar14]) / (pIVar5->xu_)._M_data[uVar14];
      }
      else if (SVar3 == FIXED) {
        pdVar12[uVar14] = 0.0;
      }
      uVar14 = uVar14 + 1;
    } while ((uVar11 & 0xffffffff) != uVar14);
  }
  if ((rb != (double *)0x0) && ((int)local_40 != 0)) {
    memcpy(pdVar13,rb,local_48);
  }
  dVar20 = (this->control_->parameters_).super_ipx_parameters.kkt_tol;
  dVar19 = Iterate::mu(this->iterate_);
  if (dVar19 < 0.0) {
    dVar19 = sqrt(dVar19);
  }
  else {
    dVar19 = SQRT(dVar19);
  }
  KKTSolver::Solve(this->kkt_,&local_58,&local_68,dVar20 * dVar19,&step->x,&step->y,this->info_);
  if ((this->info_->super_ipx_info).errflag == 0) {
    sVar16 = (step->y)._M_size;
    pdVar12 = (step->y)._M_data;
    if (0 < (long)sVar16) {
      pdVar13 = pdVar12;
      do {
        *pdVar13 = -*pdVar13;
        pdVar13 = pdVar13 + 1;
      } while (pdVar13 < pdVar12 + sVar16);
    }
    if (0 < iVar15) {
      pSVar7 = (this->iterate_->variable_state_).
               super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar13 = (step->x)._M_data;
      pdVar8 = (step->xl)._M_data;
      pdVar18 = (step->zl)._M_data;
      uVar11 = uVar11 & 0xffffffff;
      uVar14 = 0;
      do {
        SVar3 = pSVar7[uVar14];
        if (((SVar3 - IMPLIED_LB < 3) || (SVar3 == FREE)) || (SVar3 == FIXED)) {
          pdVar8[uVar14] = 0.0;
          dVar20 = 0.0;
        }
        else {
          if (rl == (double *)0x0) {
            dVar20 = 0.0;
          }
          else {
            dVar20 = rl[uVar14];
          }
          dVar20 = pdVar13[uVar14] - dVar20;
          pdVar8[uVar14] = dVar20;
          dVar20 = (sl[uVar14] - dVar20 * (pIVar5->zl_)._M_data[uVar14]) /
                   (pIVar5->xl_)._M_data[uVar14];
        }
        pdVar18[uVar14] = dVar20;
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
      if (0 < iVar15) {
        pSVar7 = (this->iterate_->variable_state_).
                 super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar13 = (step->x)._M_data;
        pdVar8 = (step->xu)._M_data;
        pdVar18 = (step->zu)._M_data;
        uVar14 = 0;
        do {
          SVar3 = pSVar7[uVar14];
          if (((SVar3 - IMPLIED_LB < 3) || (SVar3 == FREE)) || (SVar3 == FIXED)) {
            pdVar8[uVar14] = 0.0;
            dVar20 = 0.0;
          }
          else {
            if (ru == (double *)0x0) {
              dVar20 = 0.0;
            }
            else {
              dVar20 = ru[uVar14];
            }
            dVar20 = dVar20 - pdVar13[uVar14];
            pdVar8[uVar14] = dVar20;
            dVar20 = (su[uVar14] - dVar20 * (pIVar5->zu_)._M_data[uVar14]) /
                     (pIVar5->xu_)._M_data[uVar14];
          }
          pdVar18[uVar14] = dVar20;
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
        if (0 < iVar15) {
          pSVar7 = (this->iterate_->variable_state_).
                   super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar13 = (step->zl)._M_data;
          pdVar8 = (step->zu)._M_data;
          uVar14 = 0;
          do {
            if (4 < pSVar7[uVar14] - FREE) {
              piVar9 = (pMVar6->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar15 = piVar9[uVar14];
              lVar17 = (long)iVar15;
              iVar4 = piVar9[uVar14 + 1];
              dVar20 = 0.0;
              dVar19 = 0.0;
              if (iVar15 < iVar4) {
                do {
                  dVar19 = dVar19 + pdVar12[(pMVar6->AI_).rowidx_.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[lVar17]] *
                                    (pMVar6->AI_).values_.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar17];
                  lVar17 = lVar17 + 1;
                } while (iVar4 != lVar17);
              }
              if (pdVar10 != (double *)0x0) {
                dVar20 = pdVar10[uVar14];
              }
              dVar1 = (pIVar5->xl_)._M_data[uVar14];
              if ((0x7fefffffffffffff < (ulong)ABS(dVar1)) ||
                 ((dVar2 = (pIVar5->xu_)._M_data[uVar14], (ulong)ABS(dVar2) < 0x7ff0000000000000 &&
                  (dVar2 * (pIVar5->zl_)._M_data[uVar14] < dVar1 * (pIVar5->zu_)._M_data[uVar14]))))
              {
                dVar19 = dVar19 + (pdVar13[uVar14] - dVar20);
                pdVar18 = pdVar8;
              }
              else {
                dVar19 = (dVar20 + pdVar8[uVar14]) - dVar19;
                pdVar18 = pdVar13;
              }
              pdVar18[uVar14] = dVar19;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar11);
        }
      }
    }
  }
  operator_delete(local_68._M_data);
  operator_delete(local_58._M_data);
  return;
}

Assistant:

void IPM::SolveNewtonSystem(const double* rb, const double* rc,
                                    const double* rl, const double* ru,
                                    const double* sl, const double* su,
                                    Step& step) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const SparseMatrix& AI = model.AI();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();
    Vector& dx = step.x;
    Vector& dxl = step.xl;
    Vector& dxu = step.xu;
    Vector& dy = step.y;
    Vector& dzl = step.zl;
    Vector& dzu = step.zu;

    // Build RHS for KKT system.
    Vector rhs1(n+m), rhs2(m);
    if (rc) {
        for (Int j = 0; j < n+m; j++)
            rhs1[j] = -rc[j];
    }
    for (Int j = 0; j < n+m; j++) {
        double rlj = rl ? rl[j] : 0.0;
        double ruj = ru ? ru[j] : 0.0;
        if (iterate_->has_barrier_lb(j))
            rhs1[j] += (sl[j] + zl[j]*rlj) / xl[j];
        if (iterate_->has_barrier_ub(j))
            rhs1[j] -= (su[j] - zu[j]*ruj) / xu[j];
        if (iterate_->StateOf(j) == Iterate::State::fixed)
            rhs1[j] = 0.0;
    }
    assert(AllFinite(rhs1));
    if (rb)
        std::copy(rb, rb+m, std::begin(rhs2));

    // Solve KKT system.
    double tol =  control_.kkt_tol() * std::sqrt(iterate_->mu());
    kkt_->Solve(rhs1, rhs2, tol, dx, dy, info_);
    if (info_->errflag)
        return;

    // Recover solution to Newton system.
    dy *= -1.0;
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::fixed) {
            assert(dx[j] == 0.0);
            dxl[j] = 0.0;
            dzl[j] = 0.0;
        } else if (iterate_->StateOf(j) == Iterate::State::free) {
            assert(!rl || rl[j] == 0.0);
            dxl[j] = 0.0;
            dzl[j] = 0.0;
        } else {
            double rlj = rl ? rl[j] : 0.0;
            dxl[j] = dx[j] - rlj;
            dzl[j] = (sl[j] - zl[j]*dxl[j]) / xl[j];
        }
    }
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::fixed) {
            assert(dx[j] == 0.0);
            dxu[j] = 0.0;
            dzu[j] = 0.0;
        } else if (iterate_->StateOf(j) == Iterate::State::free) {
            assert(!ru || ru[j] == 0.0);
            dxu[j] = 0.0;
            dzu[j] = 0.0;
        } else {
            double ruj = ru ? ru[j] : 0.0;
            dxu[j] = ruj - dx[j];
            dzu[j] = (su[j] - zu[j]*dxu[j]) / xu[j];
        }
    }
    assert(AllFinite(dxl));
    assert(AllFinite(dxu));
    assert(AllFinite(dzl));
    assert(AllFinite(dzu));

    // Shift residual to the last two block equations.
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::barrier) {
            assert(std::isfinite(xl[j]) || std::isfinite(xu[j]));
            double atdy = DotColumn(AI, j, dy);
            double rcj = rc ? rc[j] : 0.0;
            if (std::isfinite(xl[j]) && std::isfinite(xu[j])) {
                if (zl[j]*xu[j] >= zu[j]*xl[j])
                    dzl[j] = rcj + dzu[j] - atdy;
                else
                    dzu[j] = -rcj + dzl[j] + atdy;
            } else if (std::isfinite(xl[j])) {
                dzl[j] = rcj + dzu[j] - atdy;
            } else {
                dzu[j] = -rcj + dzl[j] + atdy;
            }
        }
    }

    #ifndef NDEBUG
    // Check solution for free and fixed variables.
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->StateOf(j) == Iterate::State::fixed) {
            assert(dx[j] == 0.0);
            assert(dxl[j] == 0.0 && dxu[j] == 0.0);
            assert(dzl[j] == 0.0 && dzu[j] == 0.0);
        }
        if (iterate_->StateOf(j) == Iterate::State::free)
            assert(dzl[j] == 0.0 && dzu[j] == 0.0);
    }
    #endif
}